

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

void __thiscall QuadraticFunctor::~QuadraticFunctor(QuadraticFunctor *this)

{
  QuadraticFunctor *this_local;
  
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&this->measuredValues);
  return;
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fvec' has dimensions m x 1
        // It will contain the error for each data point.

        double aParam = x(0);
        double bParam = x(1);
        double cParam = x(2);

        for (int i = 0; i < values(); i++)
        {
            double xValue = measuredValues(i, 0);
            double yValue = measuredValues(i, 1);

            fvec(i) = yValue - (aParam * xValue * xValue + bParam * xValue + cParam);
        }
    }